

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall chrono::ChArchiveIn::in<char,200ul>(ChArchiveIn *this,ChNameValue<char[200]> *bVal)

{
  ChExceptionArchive *this_00;
  long *plVar1;
  size_type *psVar2;
  ulong uVar3;
  size_t arraysize;
  char element;
  char idname [20];
  allocator local_b9;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  undefined1 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_b8);
  if (local_b8 != 200) {
    this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_b0,bVal->_name,&local_b9);
    std::operator+(&local_58,"Size of [] saved array does not match size of receiver array ",
                   &local_b0);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
    local_90._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar2) {
      local_90.field_2._M_allocated_capacity = *psVar2;
      local_90.field_2._8_8_ = plVar1[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar2;
    }
    local_90._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ChExceptionArchive::ChExceptionArchive(this_00,&local_90);
    __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
  }
  uVar3 = 0;
  do {
    sprintf((char *)&local_58,"%lu",uVar3);
    local_60 = 0;
    local_70 = &local_58;
    local_68 = &local_b0;
    (**(code **)(*(long *)this + 0x30))(this,&local_70);
    (*bVal->_value)[uVar3] = (char)local_b0._M_dataplus._M_p;
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    uVar3 = uVar3 + 1;
  } while (uVar3 < local_b8);
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue<T[N]> bVal) {
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          if (arraysize != sizeof(bVal.value())/sizeof(T) ) {throw (ChExceptionArchive( "Size of [] saved array does not match size of receiver array " + std::string(bVal.name()) + "."));}
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }